

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

IAnimatedMeshSceneNode * __thiscall
irr::scene::CSceneManager::addAnimatedMeshSceneNode
          (CSceneManager *this,IAnimatedMesh *mesh,ISceneNode *parent,s32 id,vector3df *position,
          vector3df *rotation,vector3df *scale,bool alsoAddIfMeshPointerZero)

{
  byte bVar1;
  vector3df *in_RDX;
  vector3df *in_RSI;
  long in_RDI;
  CAnimatedMeshSceneNode *in_R8;
  IReferenceCounted *in_R9;
  byte in_stack_00000010;
  IAnimatedMeshSceneNode *node;
  ISceneManager *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  bVar1 = in_stack_00000010 & 1;
  if ((bVar1 == 0) && (in_RSI == (vector3df *)0x0)) {
    local_8 = (vector3df *)0x0;
  }
  else {
    if (in_RDX == (vector3df *)0x0) {
      in_RDX = (vector3df *)(in_RDI + 8);
    }
    local_8 = (vector3df *)operator_new(0x1b0);
    CAnimatedMeshSceneNode::CAnimatedMeshSceneNode
              (in_R8,(IAnimatedMesh *)in_R9,(ISceneNode *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,(s32)((ulong)in_RDI >> 0x20),local_8,in_RDX,in_RSI);
    IReferenceCounted::drop(in_R9);
  }
  return (IAnimatedMeshSceneNode *)local_8;
}

Assistant:

IAnimatedMeshSceneNode *CSceneManager::addAnimatedMeshSceneNode(IAnimatedMesh *mesh, ISceneNode *parent, s32 id,
		const core::vector3df &position, const core::vector3df &rotation,
		const core::vector3df &scale, bool alsoAddIfMeshPointerZero)
{
	if (!alsoAddIfMeshPointerZero && !mesh)
		return 0;

	if (!parent)
		parent = this;

	IAnimatedMeshSceneNode *node =
			new CAnimatedMeshSceneNode(mesh, parent, this, id, position, rotation, scale);
	node->drop();

	return node;
}